

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::declareStruct
          (HlslParseContext *this,TSourceLoc *loc,TString *structName,TType *type)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  ulong uVar3;
  _func_int *UNRECOVERED_JUMPTABLE;
  TTypeList *pTVar4;
  iterator iVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  TPoolAllocator *pTVar9;
  TVariable *this_00;
  undefined4 extraout_var;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_01;
  TQualifier *pTVar10;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_02;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_03;
  long lVar11;
  _func_int **pp_Var12;
  anon_union_8_2_8ac53c11_for_TType_13 aVar13;
  TType *pTVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  mapped_type *pmVar15;
  _Base_ptr p_Var16;
  ulong uVar17;
  _Base_ptr p_Var18;
  HlslParseContext *this_04;
  char *pcVar19;
  long *plVar20;
  TTypeLoc newUniformMember;
  TTypeLoc newOutputMember;
  TTypeLoc newInputMember;
  anon_union_8_2_8ac53c11_for_TType_13 local_90;
  TString *pTStack_88;
  long lStack_80;
  long lStack_78;
  TTypeLoc local_70;
  TTypeLoc local_50;
  
  iVar8 = (*type->_vptr_TType[7])(type);
  if ((iVar8 == 0x10) || (structName->_M_string_length == 0)) {
    return;
  }
  pTVar9 = GetThreadPoolAllocator();
  this_00 = (TVariable *)TPoolAllocator::allocate(pTVar9,0xf8);
  TVariable::TVariable(this_00,structName,structName,type,true);
  bVar6 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00);
  if (!bVar6) {
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    (*UNRECOVERED_JUMPTABLE)
              (this,loc,"redefinition",(structName->_M_dataplus)._M_p,"struct",UNRECOVERED_JUMPTABLE
              );
    return;
  }
  iVar8 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar8 != '\0') {
    plVar20 = *(long **)&((type->field_13).referentType)->field_0x8;
    iVar8 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar8 != '\0') {
      p_Var1 = &(this->ioTypeMap).
                super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                ._M_t._M_impl.super__Rb_tree_header;
      this_02 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0;
      this_03 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0;
      this_01 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0;
      do {
        if (plVar20 == (long *)(((type->field_13).referentType)->qualifier).semanticName) {
          iVar8 = (*type->_vptr_TType[0x25])(type);
          if (((this_01 ==
                (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0) &&
              (this_02 ==
               (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0)) &&
             (this_03 == (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0
             )) {
            if ((char)iVar8 != '\0') {
              pcVar19 = *(char **)&((type->field_13).referentType)->field_0x8;
              iVar8 = (*type->_vptr_TType[0x25])(type);
              if ((char)iVar8 != '\0') {
                do {
                  if (pcVar19 == (((type->field_13).referentType)->qualifier).semanticName) {
                    return;
                  }
                  lVar11 = (**(code **)(**(long **)pcVar19 + 0x50))();
                  *(byte *)(lVar11 + 0x10) = *(byte *)(lVar11 + 0x10) & 0xf0;
                  *(undefined8 *)(lVar11 + 0x14) = 0xffffffffffffffff;
                  uVar3 = *(ulong *)(lVar11 + 8);
                  *(undefined1 *)(lVar11 + 0x2d) = 0;
                  uVar17 = (ulong)(((uint)uVar3 & 0xff80) << 9);
                  if ((uVar3 & 0x1ff0000) != 0) {
                    uVar17 = 0;
                  }
                  *(ulong *)(lVar11 + 8) = uVar3 & 0x1fffc01f1fff007f | uVar17;
                  *(ulong *)(lVar11 + 0x1c) =
                       (ulong)((uint)*(undefined8 *)(lVar11 + 0x1c) & 0xffc00000) |
                       0xffffffff001fcfff;
                  *(ulong *)(lVar11 + 0x24) = *(ulong *)(lVar11 + 0x24) | 0xff7fffffff;
                  pcVar19 = pcVar19 + 0x20;
                  iVar8 = (*type->_vptr_TType[0x25])(type);
                } while ((char)iVar8 != '\0');
              }
            }
          }
          else if ((char)iVar8 != '\0') {
            pp_Var12 = type->_vptr_TType;
            plVar20 = *(long **)&((type->field_13).referentType)->field_0x8;
            goto LAB_0041a4c0;
          }
          break;
        }
        this_04 = (HlslParseContext *)*plVar20;
        iVar8 = (*(this_04->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])
                          ();
        bVar6 = hasUniform(this_04,(TQualifier *)CONCAT44(extraout_var,iVar8));
        if ((bVar6) &&
           (this_01 == (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0))
        {
          pTVar9 = GetThreadPoolAllocator();
          this_01 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                    TPoolAllocator::allocate(pTVar9,0x20);
          *(undefined8 *)this_01 = 0;
          *(undefined8 *)(this_01 + 8) = 0;
          *(undefined8 *)(this_01 + 0x10) = 0;
          *(undefined8 *)(this_01 + 0x18) = 0;
          pTVar9 = GetThreadPoolAllocator();
          *(TPoolAllocator **)this_01 = pTVar9;
          *(undefined8 *)(this_01 + 8) = 0;
          *(undefined8 *)(this_01 + 0x10) = 0;
          *(undefined8 *)(this_01 + 0x18) = 0;
        }
        pTVar10 = (TQualifier *)(**(code **)(*(long *)*plVar20 + 0x50))();
        bVar6 = hasInput(this,pTVar10);
        if ((bVar6) &&
           (this_02 == (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0))
        {
          pTVar9 = GetThreadPoolAllocator();
          this_02 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                    TPoolAllocator::allocate(pTVar9,0x20);
          *(undefined8 *)this_02 = 0;
          *(undefined8 *)(this_02 + 8) = 0;
          *(undefined8 *)(this_02 + 0x10) = 0;
          *(undefined8 *)(this_02 + 0x18) = 0;
          pTVar9 = GetThreadPoolAllocator();
          *(TPoolAllocator **)this_02 = pTVar9;
          *(undefined8 *)(this_02 + 8) = 0;
          *(undefined8 *)(this_02 + 0x10) = 0;
          *(undefined8 *)(this_02 + 0x18) = 0;
        }
        pTVar10 = (TQualifier *)(**(code **)(*(long *)*plVar20 + 0x50))();
        bVar6 = hasOutput(this,pTVar10);
        if ((bVar6) &&
           (this_03 == (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0))
        {
          pTVar9 = GetThreadPoolAllocator();
          this_03 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                    TPoolAllocator::allocate(pTVar9,0x20);
          *(undefined8 *)this_03 = 0;
          *(undefined8 *)(this_03 + 8) = 0;
          *(undefined8 *)(this_03 + 0x10) = 0;
          *(undefined8 *)(this_03 + 0x18) = 0;
          pTVar9 = GetThreadPoolAllocator();
          *(TPoolAllocator **)this_03 = pTVar9;
          *(undefined8 *)(this_03 + 8) = 0;
          *(undefined8 *)(this_03 + 0x10) = 0;
          *(undefined8 *)(this_03 + 0x18) = 0;
        }
        cVar7 = (**(code **)(*(long *)*plVar20 + 0x128))();
        if (cVar7 != '\0') {
          plVar2 = (long *)*plVar20;
          cVar7 = (**(code **)(*plVar2 + 0x128))(plVar2);
          if (cVar7 == '\0') break;
          p_Var16 = (this->ioTypeMap).
                    super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var16 != (_Base_ptr)0x0) {
            uVar3 = plVar2[0xd];
            p_Var18 = &p_Var1->_M_header;
            do {
              if (*(ulong *)(p_Var16 + 1) >= uVar3) {
                p_Var18 = p_Var16;
              }
              p_Var16 = (&p_Var16->_M_left)[*(ulong *)(p_Var16 + 1) < uVar3];
            } while (p_Var16 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var18 != p_Var1) &&
               (((_Rb_tree_header *)p_Var18)->_M_node_count <= uVar3)) {
              if ((*(long *)((long)p_Var18 + 0x28 + 0x10) != 0) &&
                 (this_01 ==
                  (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0)) {
                pTVar9 = GetThreadPoolAllocator();
                this_01 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                          TPoolAllocator::allocate(pTVar9,0x20);
                *(undefined8 *)this_01 = 0;
                *(undefined8 *)(this_01 + 8) = 0;
                *(undefined8 *)(this_01 + 0x10) = 0;
                *(undefined8 *)(this_01 + 0x18) = 0;
                pTVar9 = GetThreadPoolAllocator();
                *(TPoolAllocator **)this_01 = pTVar9;
                *(undefined8 *)(this_01 + 8) = 0;
                *(undefined8 *)(this_01 + 0x10) = 0;
                *(undefined8 *)(this_01 + 0x18) = 0;
              }
              if ((*(long *)((long)p_Var18 + 0x28) != 0) &&
                 (this_02 ==
                  (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0)) {
                pTVar9 = GetThreadPoolAllocator();
                this_02 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                          TPoolAllocator::allocate(pTVar9,0x20);
                *(undefined8 *)this_02 = 0;
                *(undefined8 *)(this_02 + 8) = 0;
                *(undefined8 *)(this_02 + 0x10) = 0;
                *(undefined8 *)(this_02 + 0x18) = 0;
                pTVar9 = GetThreadPoolAllocator();
                *(TPoolAllocator **)this_02 = pTVar9;
                *(undefined8 *)(this_02 + 8) = 0;
                *(undefined8 *)(this_02 + 0x10) = 0;
                *(undefined8 *)(this_02 + 0x18) = 0;
              }
              if ((*(long *)((long)p_Var18 + 0x28 + 8) != 0) &&
                 (this_03 ==
                  (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0)) {
                pTVar9 = GetThreadPoolAllocator();
                this_03 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                          TPoolAllocator::allocate(pTVar9,0x20);
                *(undefined8 *)this_03 = 0;
                *(undefined8 *)(this_03 + 8) = 0;
                *(undefined8 *)(this_03 + 0x10) = 0;
                *(undefined8 *)(this_03 + 0x18) = 0;
                pTVar9 = GetThreadPoolAllocator();
                *(TPoolAllocator **)this_03 = pTVar9;
                *(undefined8 *)(this_03 + 8) = 0;
                *(undefined8 *)(this_03 + 0x10) = 0;
                *(undefined8 *)(this_03 + 0x18) = 0;
              }
            }
          }
        }
        plVar20 = plVar20 + 4;
        iVar8 = (*type->_vptr_TType[0x25])(type);
      } while ((char)iVar8 != '\0');
    }
  }
LAB_0041a492:
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
LAB_0041a4c0:
  iVar8 = (*pp_Var12[0x25])(type);
  if ((char)iVar8 == '\0') goto LAB_0041a492;
  if (plVar20 == (long *)(((type->field_13).referentType)->qualifier).semanticName) {
    iVar8 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar8 != '\0') {
      local_90 = type->field_13;
      pmVar15 = std::
                map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                ::operator[](&(this->ioTypeMap).
                              super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                             ,&local_90.structure);
      pmVar15->input = (TTypeList *)this_02;
      pmVar15->output = (TTypeList *)this_03;
      pmVar15->uniform = (TTypeList *)this_01;
      return;
    }
    goto LAB_0041a492;
  }
  local_90.structure = (TTypeList *)0x0;
  lStack_78 = plVar20[3];
  pTStack_88 = (TString *)plVar20[1];
  lStack_80 = plVar20[2];
  local_50.type = (TType *)0x0;
  local_50.loc._16_8_ = plVar20[3];
  local_50.loc.name = (TString *)plVar20[1];
  local_50.loc._8_8_ = plVar20[2];
  local_70.type = (TType *)0x0;
  local_70.loc._16_8_ = plVar20[3];
  local_70.loc.name._0_4_ = (undefined4)plVar20[1];
  local_70.loc.name._4_4_ = *(undefined4 *)((long)plVar20 + 0xc);
  local_70.loc.string = (int)plVar20[2];
  local_70.loc.line = *(int *)((long)plVar20 + 0x14);
  cVar7 = (**(code **)(*(long *)*plVar20 + 0x128))();
  if (cVar7 != '\0') {
    plVar2 = (long *)*plVar20;
    cVar7 = (**(code **)(*plVar2 + 0x128))(plVar2);
    if (cVar7 == '\0') goto LAB_0041a492;
    p_Var16 = (this->ioTypeMap).
              super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var16 != (_Base_ptr)0x0) {
      uVar3 = plVar2[0xd];
      p_Var18 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var16 + 1) >= uVar3) {
          p_Var18 = p_Var16;
        }
        p_Var16 = (&p_Var16->_M_left)[*(ulong *)(p_Var16 + 1) < uVar3];
      } while (p_Var16 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var18 != p_Var1) &&
         (((_Rb_tree_header *)p_Var18)->_M_node_count <= uVar3)) {
        pTVar4 = *(TTypeList **)((long)p_Var18 + 0x28 + 0x10);
        if (pTVar4 != (TTypeList *)0x0) {
          pTVar9 = GetThreadPoolAllocator();
          aVar13.structure = (TTypeList *)TPoolAllocator::allocate(pTVar9,0x98);
          TType::TType(aVar13.referentType,EbtVoid,EvqTemporary,1,0,0,false);
          local_90.structure = aVar13.structure;
          TType::shallowCopy(aVar13.referentType,(TType *)*plVar20);
          aVar13 = local_90;
          iVar8 = (*(local_90.referentType)->_vptr_TType[0x25])();
          if ((char)iVar8 == '\0') goto LAB_0041aa82;
          ((aVar13.referentType)->field_13).structure = pTVar4;
        }
        pTVar4 = *(TTypeList **)((long)p_Var18 + 0x28);
        if (pTVar4 != (TTypeList *)0x0) {
          pTVar9 = GetThreadPoolAllocator();
          pTVar14 = (TType *)TPoolAllocator::allocate(pTVar9,0x98);
          TType::TType(pTVar14,EbtVoid,EvqTemporary,1,0,0,false);
          local_50.type = pTVar14;
          TType::shallowCopy(pTVar14,(TType *)*plVar20);
          pTVar14 = local_50.type;
          iVar8 = (*(local_50.type)->_vptr_TType[0x25])();
          if ((char)iVar8 == '\0') goto LAB_0041aa82;
          (pTVar14->field_13).structure = pTVar4;
        }
        pTVar4 = *(TTypeList **)((long)p_Var18 + 0x28 + 8);
        if (pTVar4 != (TTypeList *)0x0) {
          pTVar9 = GetThreadPoolAllocator();
          pTVar14 = (TType *)TPoolAllocator::allocate(pTVar9,0x98);
          TType::TType(pTVar14,EbtVoid,EvqTemporary,1,0,0,false);
          local_70.type = pTVar14;
          TType::shallowCopy(pTVar14,(TType *)*plVar20);
          pTVar14 = local_70.type;
          iVar8 = (*(local_70.type)->_vptr_TType[0x25])(local_70.type);
          if ((char)iVar8 == '\0') {
LAB_0041aa82:
            __assert_fail("isStruct()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                          ,0x9e0,"void glslang::TType::setStruct(TTypeList *)");
          }
          (pTVar14->field_13).structure = pTVar4;
        }
      }
    }
  }
  if (this_01 != (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0) {
    if ((TType *)local_90.structure == (TType *)0x0) {
      pTVar9 = GetThreadPoolAllocator();
      aVar13.structure = (TTypeList *)TPoolAllocator::allocate(pTVar9,0x98);
      TType::TType(aVar13.referentType,EbtVoid,EvqTemporary,1,0,0,false);
      local_90.structure = aVar13.structure;
      TType::shallowCopy(aVar13.referentType,(TType *)*plVar20);
    }
    cVar7 = (**(code **)(*(long *)*plVar20 + 0xe0))();
    if ((cVar7 != '\0') &&
       (lVar11 = (**(code **)(*(long *)*plVar20 + 0x50))(),
       *(ulong *)(lVar11 + 8) < 0x2000000000000000)) {
      uVar3 = *(ulong *)&(this->globalUniformDefaults).field_0x8;
      iVar8 = (*(local_90.referentType)->_vptr_TType[10])();
      *(ulong *)(CONCAT44(extraout_var_00,iVar8) + 8) =
           *(ulong *)(CONCAT44(extraout_var_00,iVar8) + 8) & 0x1fffffffffffffff |
           uVar3 & 0xe000000000000000;
    }
    iVar8 = (*(local_90.referentType)->_vptr_TType[10])();
    lVar11 = CONCAT44(extraout_var_01,iVar8);
    uVar3 = *(ulong *)(lVar11 + 8);
    uVar17 = (ulong)(((uint)uVar3 & 0xff80) << 9);
    if ((uVar3 & 0x1ff0000) != 0) {
      uVar17 = 0;
    }
    *(ulong *)(lVar11 + 8) = uVar3 & 0xffffc01f1fff007f | uVar17;
    *(ulong *)(lVar11 + 0x1c) = *(ulong *)(lVar11 + 0x1c) & 0xffffffff8000 | 0xffff000000004fff;
    *(uint *)(lVar11 + 0x24) = *(uint *)(lVar11 + 0x24) | 0x7fffffff;
    iVar5._M_current = *(TTypeLoc **)(this_01 + 0x10);
    if (iVar5._M_current == *(TTypeLoc **)(this_01 + 0x18)) {
      std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
      _M_realloc_insert<glslang::TTypeLoc_const&>(this_01,iVar5,(TTypeLoc *)&local_90);
    }
    else {
      ((iVar5._M_current)->loc).string = (undefined4)lStack_80;
      ((iVar5._M_current)->loc).line = lStack_80._4_4_;
      *(long *)&((iVar5._M_current)->loc).column = lStack_78;
      (iVar5._M_current)->type = (TType *)local_90;
      ((iVar5._M_current)->loc).name = pTStack_88;
      *(long *)(this_01 + 0x10) = *(long *)(this_01 + 0x10) + 0x20;
    }
  }
  if (this_02 != (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0) {
    if (local_50.type == (TType *)0x0) {
      pTVar9 = GetThreadPoolAllocator();
      pTVar14 = (TType *)TPoolAllocator::allocate(pTVar9,0x98);
      TType::TType(pTVar14,EbtVoid,EvqTemporary,1,0,0,false);
      local_50.type = pTVar14;
      TType::shallowCopy(pTVar14,(TType *)*plVar20);
    }
    iVar8 = (*(local_50.type)->_vptr_TType[10])();
    correctInput(this,(TQualifier *)CONCAT44(extraout_var_02,iVar8));
    iVar5._M_current = *(TTypeLoc **)(this_02 + 0x10);
    if (iVar5._M_current == *(TTypeLoc **)(this_02 + 0x18)) {
      std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
      _M_realloc_insert<glslang::TTypeLoc_const&>(this_02,iVar5,&local_50);
    }
    else {
      ((iVar5._M_current)->loc).string = local_50.loc.string;
      ((iVar5._M_current)->loc).line = local_50.loc.line;
      ((iVar5._M_current)->loc).column = local_50.loc.column;
      *(undefined4 *)&((iVar5._M_current)->loc).field_0x14 = local_50.loc._20_4_;
      (iVar5._M_current)->type = local_50.type;
      ((iVar5._M_current)->loc).name = local_50.loc.name;
      *(long *)(this_02 + 0x10) = *(long *)(this_02 + 0x10) + 0x20;
    }
  }
  if (this_03 != (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0) {
    if (local_70.type == (TType *)0x0) {
      pTVar9 = GetThreadPoolAllocator();
      pTVar14 = (TType *)TPoolAllocator::allocate(pTVar9,0x98);
      TType::TType(pTVar14,EbtVoid,EvqTemporary,1,0,0,false);
      local_70.type = pTVar14;
      TType::shallowCopy(pTVar14,(TType *)*plVar20);
    }
    iVar8 = (*(local_70.type)->_vptr_TType[10])();
    correctOutput(this,(TQualifier *)CONCAT44(extraout_var_03,iVar8));
    iVar5._M_current = *(TTypeLoc **)(this_03 + 0x10);
    if (iVar5._M_current == *(TTypeLoc **)(this_03 + 0x18)) {
      std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
      _M_realloc_insert<glslang::TTypeLoc_const&>(this_03,iVar5,&local_70);
    }
    else {
      ((iVar5._M_current)->loc).string = local_70.loc.string;
      ((iVar5._M_current)->loc).line = local_70.loc.line;
      ((iVar5._M_current)->loc).column = local_70.loc.column;
      *(undefined4 *)&((iVar5._M_current)->loc).field_0x14 = local_70.loc._20_4_;
      (iVar5._M_current)->type = local_70.type;
      ((iVar5._M_current)->loc).name =
           (TString *)CONCAT44(local_70.loc.name._4_4_,local_70.loc.name._0_4_);
      *(long *)(this_03 + 0x10) = *(long *)(this_03 + 0x10) + 0x20;
    }
  }
  lVar11 = (**(code **)(*(long *)*plVar20 + 0x50))();
  *(byte *)(lVar11 + 0x10) = *(byte *)(lVar11 + 0x10) & 0xf0;
  *(undefined8 *)(lVar11 + 0x14) = 0xffffffffffffffff;
  uVar3 = *(ulong *)(lVar11 + 8);
  *(undefined1 *)(lVar11 + 0x2d) = 0;
  uVar17 = (ulong)(((uint)uVar3 & 0xff80) << 9);
  if ((uVar3 & 0x1ff0000) != 0) {
    uVar17 = 0;
  }
  *(ulong *)(lVar11 + 8) = uVar3 & 0x1fffc01f1fff007f | uVar17;
  *(ulong *)(lVar11 + 0x1c) =
       (ulong)((uint)*(undefined8 *)(lVar11 + 0x1c) & 0xffc00000) | 0xffffffff001fcfff;
  *(ulong *)(lVar11 + 0x24) = *(ulong *)(lVar11 + 0x24) | 0xff7fffffff;
  plVar20 = plVar20 + 4;
  pp_Var12 = type->_vptr_TType;
  goto LAB_0041a4c0;
}

Assistant:

void HlslParseContext::declareStruct(const TSourceLoc& loc, TString& structName, TType& type)
{
    // If it was named, which means the type can be reused later, add
    // it to the symbol table.  (Unless it's a block, in which
    // case the name is not a type.)
    if (type.getBasicType() == EbtBlock || structName.size() == 0)
        return;

    TVariable* userTypeDef = new TVariable(&structName, type, true);
    if (! symbolTable.insert(*userTypeDef)) {
        error(loc, "redefinition", structName.c_str(), "struct");
        return;
    }

    // See if we need IO aliases for the structure typeList

    const auto condAlloc = [](bool pred, TTypeList*& list) {
        if (pred && list == nullptr)
            list = new TTypeList;
    };

    tIoKinds newLists = { nullptr, nullptr, nullptr }; // allocate for each kind found
    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
        condAlloc(hasUniform(member->type->getQualifier()), newLists.uniform);
        condAlloc(  hasInput(member->type->getQualifier()), newLists.input);
        condAlloc( hasOutput(member->type->getQualifier()), newLists.output);

        if (member->type->isStruct()) {
            auto it = ioTypeMap.find(member->type->getStruct());
            if (it != ioTypeMap.end()) {
                condAlloc(it->second.uniform != nullptr, newLists.uniform);
                condAlloc(it->second.input   != nullptr, newLists.input);
                condAlloc(it->second.output  != nullptr, newLists.output);
            }
        }
    }
    if (newLists.uniform == nullptr &&
        newLists.input   == nullptr &&
        newLists.output  == nullptr) {
        // Won't do any IO caching, clear up the type and get out now.
        for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member)
            clearUniformInputOutput(member->type->getQualifier());
        return;
    }

    // We have IO involved.

    // Make a pure typeList for the symbol table, and cache side copies of IO versions.
    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
        const auto inheritStruct = [&](TTypeList* s, TTypeLoc& ioMember) {
            if (s != nullptr) {
                ioMember.type = new TType;
                ioMember.type->shallowCopy(*member->type);
                ioMember.type->setStruct(s);
            }
        };
        const auto newMember = [&](TTypeLoc& m) {
            if (m.type == nullptr) {
                m.type = new TType;
                m.type->shallowCopy(*member->type);
            }
        };

        TTypeLoc newUniformMember = { nullptr, member->loc };
        TTypeLoc newInputMember   = { nullptr, member->loc };
        TTypeLoc newOutputMember  = { nullptr, member->loc };
        if (member->type->isStruct()) {
            // swap in an IO child if there is one
            auto it = ioTypeMap.find(member->type->getStruct());
            if (it != ioTypeMap.end()) {
                inheritStruct(it->second.uniform, newUniformMember);
                inheritStruct(it->second.input,   newInputMember);
                inheritStruct(it->second.output,  newOutputMember);
            }
        }
        if (newLists.uniform) {
            newMember(newUniformMember);

            // inherit default matrix layout (changeable via #pragma pack_matrix), if none given.
            if (member->type->isMatrix() && member->type->getQualifier().layoutMatrix == ElmNone)
                newUniformMember.type->getQualifier().layoutMatrix = globalUniformDefaults.layoutMatrix;

            correctUniform(newUniformMember.type->getQualifier());
            newLists.uniform->push_back(newUniformMember);
        }
        if (newLists.input) {
            newMember(newInputMember);
            correctInput(newInputMember.type->getQualifier());
            newLists.input->push_back(newInputMember);
        }
        if (newLists.output) {
            newMember(newOutputMember);
            correctOutput(newOutputMember.type->getQualifier());
            newLists.output->push_back(newOutputMember);
        }

        // make original pure
        clearUniformInputOutput(member->type->getQualifier());
    }
    ioTypeMap[type.getStruct()] = newLists;
}